

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O3

bool __thiscall
crnd::crn_unpacker::unpack_dxt1
          (crn_unpacker *this,uint8 **pDst,uint32 output_pitch_in_bytes,uint32 output_width,
          uint32 output_height)

{
  symbol_codec *this_00;
  vector<crnd::crn_unpacker::block_buffer_element> *this_01;
  uint uVar1;
  bool bVar2;
  byte bVar3;
  uint32 uVar4;
  crn_header *pcVar5;
  uint uVar6;
  ulong uVar7;
  uint32 x;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  block_buffer_element *pbVar12;
  uint uVar13;
  uint *puVar14;
  uint min_new_capacity;
  
  uVar1 = (this->m_color_endpoints).m_size;
  uVar11 = (this->m_block_buffer).m_size;
  min_new_capacity = output_width + 1 & 0xfffffffe;
  this_01 = &this->m_block_buffer;
  if (uVar11 < min_new_capacity) {
    if ((this->m_block_buffer).m_capacity < min_new_capacity) {
      bVar2 = elemental_vector::increase_capacity
                        ((elemental_vector *)this_01,min_new_capacity,uVar11 + 1 == min_new_capacity
                         ,8,(object_mover)0x0);
      if (!bVar2) {
        (this->m_block_buffer).m_alloc_failed = true;
        goto LAB_001154b4;
      }
    }
    (this->m_block_buffer).m_size = min_new_capacity;
  }
LAB_001154b4:
  pcVar5 = this->m_pHeader;
  if ((pcVar5->m_faces).m_buf[0] != '\0') {
    uVar6 = output_height + 1 & 0xfffffffe;
    this_00 = &this->m_codec;
    uVar7 = 0;
    uVar11 = 0;
    uVar10 = 0;
    do {
      if (uVar6 != 0) {
        puVar14 = (uint *)pDst[uVar7];
        uVar13 = 0;
        do {
          if (min_new_capacity != 0) {
            bVar2 = uVar13 < output_height;
            uVar8 = 0;
            do {
              uVar9 = (uint)uVar10;
              if (((uVar13 | (uint)uVar8) & 1) == 0) {
                uVar4 = symbol_codec::decode(this_00,&this->m_reference_encoding_dm);
                uVar10 = (ulong)uVar4;
                pbVar12 = this_01->m_p + uVar8;
LAB_001155b3:
                bVar3 = (byte)uVar10 & 3;
                pbVar12->endpoint_reference = (ushort)((byte)(uVar10 >> 2) & 3);
                uVar9 = (uint)(uVar10 >> 4) & 0xf;
              }
              else {
                pbVar12 = this_01->m_p + uVar8;
                if ((uVar13 & 1) == 0) goto LAB_001155b3;
                bVar3 = (byte)pbVar12->endpoint_reference;
              }
              uVar10 = (ulong)uVar9;
              if (bVar3 == 1) {
                pbVar12->color_endpoint_index = (uint16)uVar11;
              }
              else if (bVar3 == 0) {
                uVar4 = symbol_codec::decode(this_00,this->m_endpoint_delta_dm);
                uVar9 = uVar1;
                if (uVar4 + uVar11 < uVar1) {
                  uVar9 = 0;
                }
                uVar11 = (uVar4 + uVar11) - uVar9;
                pbVar12->color_endpoint_index = (uint16)uVar11;
              }
              else {
                uVar11 = (uint)pbVar12->color_endpoint_index;
              }
              bVar2 = (bool)(bVar2 & uVar8 < output_width);
              uVar4 = symbol_codec::decode(this_00,this->m_selector_delta_dm);
              if (bVar2) {
                *puVar14 = (this->m_color_endpoints).m_p[uVar11];
                puVar14[1] = (this->m_color_selectors).m_p[uVar4];
              }
              uVar8 = uVar8 + 1;
              puVar14 = puVar14 + 2;
            } while (uVar8 != min_new_capacity);
          }
          uVar13 = uVar13 + 1;
          puVar14 = puVar14 + (int)((output_pitch_in_bytes >> 2) + min_new_capacity * -2);
        } while (uVar13 != uVar6);
        pcVar5 = this->m_pHeader;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (pcVar5->m_faces).m_buf[0]);
  }
  return true;
}

Assistant:

bool unpack_dxt1(uint8** pDst, uint32 output_pitch_in_bytes, uint32 output_width, uint32 output_height) {
    const uint32 num_color_endpoints = m_color_endpoints.size();
    const uint32 width = (output_width + 1) & ~1;
    const uint32 height = (output_height + 1) & ~1;
    const int32 delta_pitch_in_dwords = (output_pitch_in_bytes >> 2) - (width << 1);

    if (m_block_buffer.size() < width)
      m_block_buffer.resize(width);

    uint32 color_endpoint_index = 0;
    uint8 reference_group = 0;

    for (uint32 f = 0; f < m_pHeader->m_faces; f++) {
      uint32* pData = (uint32*)pDst[f];
      for (uint32 y = 0; y < height; y++, pData += delta_pitch_in_dwords) {
        bool visible = y < output_height;
        for (uint32 x = 0; x < width; x++, pData += 2) {
          visible = visible && x < output_width;
          if (!(y & 1) && !(x & 1))
            reference_group = m_codec.decode(m_reference_encoding_dm);
          block_buffer_element &buffer = m_block_buffer[x];
          uint8 endpoint_reference;
          if (y & 1) {
            endpoint_reference = buffer.endpoint_reference;
          } else {
            endpoint_reference = reference_group & 3;
            reference_group >>= 2;
            buffer.endpoint_reference = reference_group & 3;
            reference_group >>= 2;
          }
          if (!endpoint_reference) {
            color_endpoint_index += m_codec.decode(m_endpoint_delta_dm[0]);
            if (color_endpoint_index >= num_color_endpoints)
              color_endpoint_index -= num_color_endpoints;
            buffer.color_endpoint_index = color_endpoint_index;
          } else if (endpoint_reference == 1) {
            buffer.color_endpoint_index = color_endpoint_index;
          } else {
            color_endpoint_index = buffer.color_endpoint_index;
          }
          uint32 color_selector_index = m_codec.decode(m_selector_delta_dm[0]);
          if (visible) {
            pData[0] = m_color_endpoints[color_endpoint_index];
            pData[1] = m_color_selectors[color_selector_index];
          }
        }
      }
    }
    return true;
  }